

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect,char aff)

{
  u32 *puVar1;
  sqlite3 *db;
  ulong uVar2;
  Table *pTab;
  Select *pSelect_00;
  
  db = pParse->db;
  uVar2 = db->flags;
  db->flags = uVar2 & 0xffffffffffffffbb | 0x40;
  sqlite3SelectPrep(pParse,pSelect,(NameContext *)0x0);
  db->flags = uVar2;
  if (pParse->nErr != 0) {
    return (Table *)0x0;
  }
  do {
    pSelect_00 = pSelect;
    pSelect = pSelect_00->pPrior;
  } while (pSelect_00->pPrior != (Select *)0x0);
  pTab = (Table *)sqlite3DbMallocZero(db,0x68);
  if (pTab != (Table *)0x0) {
    pTab->nTabRef = 1;
    pTab->zName = (char *)0x0;
    pTab->nRowLogEst = 200;
    sqlite3ColumnsFromExprList((Parse *)pParse->db,pSelect_00->pEList,&pTab->nCol,&pTab->aCol);
    sqlite3SelectAddColumnTypeAndCollation(pParse,pTab,pSelect_00,aff);
    pTab->iPKey = -1;
    if (db->mallocFailed == '\0') {
      return pTab;
    }
    if (db->pnBytesFreed == (int *)0x0) {
      puVar1 = &pTab->nTabRef;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        return (Table *)0x0;
      }
    }
    deleteTable(db,pTab);
  }
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect, char aff){
  Table *pTab;
  sqlite3 *db = pParse->db;
  u64 savedFlags;

  savedFlags = db->flags;
  db->flags &= ~(u64)SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  db->flags = savedFlags;
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  pTab->nTabRef = 1;
  pTab->zName = 0;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  sqlite3ColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSelect, aff);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}